

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *descriptor,
          FlatAllocator *alloc)

{
  Span<const_int> options_path_00;
  string_view option_name;
  OptionsType *pOVar1;
  string_view name_scope;
  string_view element_name;
  vector<int,_std::allocator<int>_> options_path;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  undefined8 local_c8;
  char *pcStack_c0;
  pointer local_b8;
  size_type sStack_b0;
  string local_a8;
  size_type local_88;
  pointer local_80;
  AlphaNum local_58;
  
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = CONCAT44(local_88._4_4_,8);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_e8,(int *)&local_88);
  local_80 = (descriptor->package_->_M_dataplus)._M_p;
  local_88 = descriptor->package_->_M_string_length;
  local_58.piece_ = absl::lts_20250127::NullSafeStringView(".dummy");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_a8,(lts_20250127 *)&local_88,&local_58,&local_58);
  sStack_b0 = (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8._M_impl.super__Vector_impl_data._M_start >> 2;
  local_b8 = local_e8._M_impl.super__Vector_impl_data._M_start;
  local_c8 = 0x1b;
  pcStack_c0 = "google.protobuf.FileOptions";
  options_path_00.len_ = sStack_b0;
  options_path_00.ptr_ = local_e8._M_impl.super__Vector_impl_data._M_start;
  option_name._M_str = "google.protobuf.FileOptions";
  option_name._M_len = 0x1b;
  name_scope._M_str = local_a8._M_dataplus._M_p;
  name_scope._M_len = local_a8._M_string_length;
  element_name._M_str = (descriptor->name_->_M_dataplus)._M_p;
  element_name._M_len = descriptor->name_->_M_string_length;
  pOVar1 = AllocateOptionsImpl<google::protobuf::FileDescriptor>
                     (this,name_scope,element_name,proto,options_path_00,option_name,alloc);
  std::__cxx11::string::~string((string *)&local_a8);
  descriptor->options_ = pOVar1;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileDescriptorProto& proto,
                                        FileDescriptor* descriptor,
                                        internal::FlatAllocator& alloc) {
  std::vector<int> options_path;
  options_path.push_back(FileDescriptorProto::kOptionsFieldNumber);
  // We add the dummy token so that LookupSymbol does the right thing.
  auto options = AllocateOptionsImpl<FileDescriptor>(
      absl::StrCat(descriptor->package(), ".dummy"), descriptor->name(), proto,
      options_path, "google.protobuf.FileOptions", alloc);
  descriptor->options_ = options;
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();
}